

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall slang::driver::Driver::addParseOptions(Driver *this,Bag *bag)

{
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *this_00;
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  undefined1 *puVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  slot_type *psVar9;
  group_type_pointer pgVar10;
  value_type_pointer ppVar11;
  Bag *this_01;
  group_type_pointer pgVar12;
  value_type_pointer pbVar13;
  bool bVar14;
  byte bVar15;
  byte bVar16;
  uint uVar17;
  uint64_t uVar18;
  group_type_pointer pgVar19;
  slot_type *psVar20;
  pointer pbVar21;
  ulong uVar22;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
  *ppVar23;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
  *ppVar24;
  pointer pbVar25;
  pointer pcVar26;
  long lVar27;
  ulong uVar28;
  pointer pbVar29;
  pointer pbVar30;
  pointer pcVar31;
  ulong uVar32;
  pointer pbVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  byte bVar50;
  uchar uVar51;
  uchar uVar52;
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  byte bVar57;
  uchar uVar58;
  uchar uVar59;
  uchar uVar60;
  byte bVar61;
  try_emplace_args_t local_2c1;
  group_type_pointer local_2c0;
  pointer local_2b8;
  undefined1 local_2b0 [16];
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
  *local_2a0;
  undefined8 local_298;
  uchar uStack_290;
  uchar uStack_28f;
  uchar uStack_28e;
  byte bStack_28d;
  uchar uStack_28c;
  uchar uStack_28b;
  uchar uStack_28a;
  byte bStack_289;
  basic_string_view<char,_std::char_traits<char>_> local_288;
  undefined8 local_278;
  uchar uStack_270;
  uchar uStack_26f;
  uchar uStack_26e;
  byte bStack_26d;
  uchar uStack_26c;
  uchar uStack_26b;
  uchar uStack_26a;
  byte bStack_269;
  undefined8 local_268;
  uchar uStack_260;
  uchar uStack_25f;
  uchar uStack_25e;
  byte bStack_25d;
  uchar uStack_25c;
  uchar uStack_25b;
  uchar uStack_25a;
  byte bStack_259;
  pointer local_250;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  LexerOptions loptions;
  SourceOptions local_1c8;
  Bag *local_1b8;
  ulong local_1b0;
  uchar local_1a8;
  uchar uStack_1a7;
  uchar uStack_1a6;
  byte bStack_1a5;
  uchar uStack_1a4;
  uchar uStack_1a3;
  uchar uStack_1a2;
  byte bStack_1a1;
  uchar uStack_1a0;
  uchar uStack_19f;
  uchar uStack_19e;
  byte bStack_19d;
  uchar uStack_19c;
  uchar uStack_19b;
  uchar uStack_19a;
  byte bStack_199;
  uchar local_198;
  uchar uStack_197;
  uchar uStack_196;
  byte bStack_195;
  uchar uStack_194;
  uchar uStack_193;
  uchar uStack_192;
  byte bStack_191;
  uchar uStack_190;
  uchar uStack_18f;
  uchar uStack_18e;
  byte bStack_18d;
  uchar uStack_18c;
  uchar uStack_18b;
  uchar uStack_18a;
  byte bStack_189;
  uchar local_188;
  uchar uStack_187;
  uchar uStack_186;
  byte bStack_185;
  uchar uStack_184;
  uchar uStack_183;
  uchar uStack_182;
  byte bStack_181;
  uchar uStack_180;
  uchar uStack_17f;
  uchar uStack_17e;
  byte bStack_17d;
  uchar uStack_17c;
  uchar uStack_17b;
  uchar uStack_17a;
  byte bStack_179;
  uchar local_178;
  uchar uStack_177;
  uchar uStack_176;
  byte bStack_175;
  uchar uStack_174;
  uchar uStack_173;
  uchar uStack_172;
  byte bStack_171;
  uchar uStack_170;
  uchar uStack_16f;
  uchar uStack_16e;
  byte bStack_16d;
  uchar uStack_16c;
  uchar uStack_16b;
  uchar uStack_16a;
  byte bStack_169;
  uchar local_168;
  uchar uStack_167;
  uchar uStack_166;
  byte bStack_165;
  uchar uStack_164;
  uchar uStack_163;
  uchar uStack_162;
  byte bStack_161;
  uchar uStack_160;
  uchar uStack_15f;
  uchar uStack_15e;
  byte bStack_15d;
  uchar uStack_15c;
  uchar uStack_15b;
  uchar uStack_15a;
  byte bStack_159;
  uchar local_158;
  uchar uStack_157;
  uchar uStack_156;
  byte bStack_155;
  uchar uStack_154;
  uchar uStack_153;
  uchar uStack_152;
  byte bStack_151;
  uchar uStack_150;
  uchar uStack_14f;
  uchar uStack_14e;
  byte bStack_14d;
  uchar uStack_14c;
  uchar uStack_14b;
  uchar uStack_14a;
  byte bStack_149;
  uchar local_148;
  uchar uStack_147;
  uchar uStack_146;
  byte bStack_145;
  uchar uStack_144;
  uchar uStack_143;
  uchar uStack_142;
  byte bStack_141;
  uchar uStack_140;
  uchar uStack_13f;
  uchar uStack_13e;
  byte bStack_13d;
  uchar uStack_13c;
  uchar uStack_13b;
  uchar uStack_13a;
  byte bStack_139;
  uchar local_138;
  uchar uStack_137;
  uchar uStack_136;
  byte bStack_135;
  uchar uStack_134;
  uchar uStack_133;
  uchar uStack_132;
  byte bStack_131;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  byte bStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  byte bStack_129;
  uchar local_128;
  uchar uStack_127;
  uchar uStack_126;
  byte bStack_125;
  uchar uStack_124;
  uchar uStack_123;
  uchar uStack_122;
  byte bStack_121;
  uchar uStack_120;
  uchar uStack_11f;
  uchar uStack_11e;
  byte bStack_11d;
  uchar uStack_11c;
  uchar uStack_11b;
  uchar uStack_11a;
  byte bStack_119;
  uchar local_118;
  uchar uStack_117;
  uchar uStack_116;
  byte bStack_115;
  uchar uStack_114;
  uchar uStack_113;
  uchar uStack_112;
  byte bStack_111;
  uchar uStack_110;
  uchar uStack_10f;
  uchar uStack_10e;
  byte bStack_10d;
  uchar uStack_10c;
  uchar uStack_10b;
  uchar uStack_10a;
  byte bStack_109;
  uchar local_108;
  uchar uStack_107;
  uchar uStack_106;
  byte bStack_105;
  uchar uStack_104;
  uchar uStack_103;
  uchar uStack_102;
  byte bStack_101;
  uchar uStack_100;
  uchar uStack_ff;
  uchar uStack_fe;
  byte bStack_fd;
  uchar uStack_fc;
  uchar uStack_fb;
  uchar uStack_fa;
  byte bStack_f9;
  uchar local_f8;
  uchar uStack_f7;
  uchar uStack_f6;
  byte bStack_f5;
  uchar uStack_f4;
  uchar uStack_f3;
  uchar uStack_f2;
  byte bStack_f1;
  uchar uStack_f0;
  uchar uStack_ef;
  uchar uStack_ee;
  byte bStack_ed;
  uchar uStack_ec;
  uchar uStack_eb;
  uchar uStack_ea;
  byte bStack_e9;
  uchar local_e8;
  uchar uStack_e7;
  uchar uStack_e6;
  byte bStack_e5;
  uchar uStack_e4;
  uchar uStack_e3;
  uchar uStack_e2;
  byte bStack_e1;
  uchar uStack_e0;
  uchar uStack_df;
  uchar uStack_de;
  byte bStack_dd;
  uchar uStack_dc;
  uchar uStack_db;
  uchar uStack_da;
  byte bStack_d9;
  PreprocessorOptions ppoptions;
  
  local_1c8.numThreads.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       *(_Optional_base<unsigned_int,_true,_true> *)
        &(this->options).numThreads.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>;
  local_1c8.singleUnit =
       (bool)((this->options).singleUnit.super__Optional_base<bool,_true,_true>._M_payload.
              super__Optional_payload_base<bool>._M_payload._M_value != false &
             (this->options).singleUnit.super__Optional_base<bool,_true,_true>._M_payload.
             super__Optional_payload_base<bool>._M_engaged);
  local_1c8.onlyLint = Options::lintMode(&this->options);
  local_1c8.librariesInheritMacros =
       (bool)((this->options).librariesInheritMacros.super__Optional_base<bool,_true,_true>.
              _M_payload.super__Optional_payload_base<bool>._M_payload._M_value != false &
             (this->options).librariesInheritMacros.super__Optional_base<bool,_true,_true>.
             _M_payload.super__Optional_payload_base<bool>._M_engaged);
  parsing::PreprocessorOptions::PreprocessorOptions(&ppoptions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&ppoptions.predefines,&(this->options).defines);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&ppoptions.undefines,&(this->options).undefines);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&ppoptions.predefineSource,"<command-line>");
  ppoptions.languageVersion = this->languageVersion;
  if ((this->options).maxIncludeDepth.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    ppoptions.maxIncludeDepth =
         (this->options).maxIncludeDepth.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload._M_value;
  }
  local_2b8 = (this->options).ignoreDirectives.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  pbVar25 = (this->options).ignoreDirectives.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1b8 = bag;
  while (pbVar25 != local_2b8) {
    local_2b0._8_8_ = (pbVar25->_M_dataplus)._M_p;
    local_2b0._0_8_ = pbVar25->_M_string_length;
    local_298 = pbVar25;
    uVar18 = detail::hashing::hash((void *)local_2b0._8_8_,local_2b0._0_8_);
    pbVar33 = (pointer)(uVar18 >>
                       ((byte)ppoptions.ignoreDirectives.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                              .arrays.groups_size_index & 0x3f));
    lVar27 = (uVar18 & 0xff) * 4;
    uVar47 = (&UNK_0040c7ac)[lVar27];
    uVar48 = (&UNK_0040c7ad)[lVar27];
    uVar49 = (&UNK_0040c7ae)[lVar27];
    bVar50 = (&UNK_0040c7af)[lVar27];
    psVar20 = (slot_type *)0x0;
    pbVar25 = pbVar33;
    uVar51 = uVar47;
    uVar52 = uVar48;
    uVar53 = uVar49;
    bVar16 = bVar50;
    uVar54 = uVar47;
    uVar55 = uVar48;
    uVar56 = uVar49;
    bVar57 = bVar50;
    uVar58 = uVar47;
    uVar59 = uVar48;
    uVar60 = uVar49;
    bVar61 = bVar50;
    do {
      pbVar13 = ppoptions.ignoreDirectives.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .arrays.elements_;
      pgVar12 = ppoptions.ignoreDirectives.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .arrays.groups_;
      pgVar2 = ppoptions.ignoreDirectives.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.groups_ + (long)pbVar25;
      local_e8 = pgVar2->m[0].n;
      uStack_e7 = pgVar2->m[1].n;
      uStack_e6 = pgVar2->m[2].n;
      bStack_e5 = pgVar2->m[3].n;
      uStack_e4 = pgVar2->m[4].n;
      uStack_e3 = pgVar2->m[5].n;
      uStack_e2 = pgVar2->m[6].n;
      bStack_e1 = pgVar2->m[7].n;
      uStack_e0 = pgVar2->m[8].n;
      uStack_df = pgVar2->m[9].n;
      uStack_de = pgVar2->m[10].n;
      bStack_dd = pgVar2->m[0xb].n;
      uStack_dc = pgVar2->m[0xc].n;
      uStack_db = pgVar2->m[0xd].n;
      uStack_da = pgVar2->m[0xe].n;
      bVar15 = pgVar2->m[0xf].n;
      auVar34[0] = -(local_e8 == uVar47);
      auVar34[1] = -(uStack_e7 == uVar48);
      auVar34[2] = -(uStack_e6 == uVar49);
      auVar34[3] = -(bStack_e5 == bVar50);
      auVar34[4] = -(uStack_e4 == uVar51);
      auVar34[5] = -(uStack_e3 == uVar52);
      auVar34[6] = -(uStack_e2 == uVar53);
      auVar34[7] = -(bStack_e1 == bVar16);
      auVar34[8] = -(uStack_e0 == uVar54);
      auVar34[9] = -(uStack_df == uVar55);
      auVar34[10] = -(uStack_de == uVar56);
      auVar34[0xb] = -(bStack_dd == bVar57);
      auVar34[0xc] = -(uStack_dc == uVar58);
      auVar34[0xd] = -(uStack_db == uVar59);
      auVar34[0xe] = -(uStack_da == uVar60);
      auVar34[0xf] = -(bVar15 == bVar61);
      uVar17 = (uint)(ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe);
      bStack_d9 = bVar15;
      if (uVar17 != 0) {
        local_268._0_2_ = CONCAT11(uVar48,uVar47);
        local_268._0_3_ = CONCAT12(uVar49,(undefined2)local_268);
        local_268._0_4_ = CONCAT13(bVar50,(undefined3)local_268);
        local_268._0_5_ = CONCAT14(uVar51,(undefined4)local_268);
        local_268._0_6_ = CONCAT15(uVar52,(undefined5)local_268);
        local_268._0_7_ = CONCAT16(uVar53,(undefined6)local_268);
        local_268 = (pointer)CONCAT17(bVar16,(undefined7)local_268);
        local_2c0 = (group_type_pointer)psVar20;
        local_278 = pbVar25;
        uStack_260 = uVar54;
        uStack_25f = uVar55;
        uStack_25e = uVar56;
        bStack_25d = bVar57;
        uStack_25c = uVar58;
        uStack_25b = uVar59;
        uStack_25a = uVar60;
        bStack_259 = bVar61;
        do {
          iVar7 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
            }
          }
          bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              &ppoptions.ignoreDirectives,
                              (basic_string_view<char,_std::char_traits<char>_> *)local_2b0,
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              ((long)&pbVar13[(long)pbVar25 * 0xf]._M_len +
                              (ulong)(uint)(iVar7 << 4)));
          if (bVar14) goto LAB_0017a5e4;
          uVar17 = uVar17 - 1 & uVar17;
        } while (uVar17 != 0);
        bVar15 = pgVar12[(long)pbVar25].m[0xf].n;
        psVar20 = local_2c0->m;
        pbVar25 = local_278;
        uVar47 = (uchar)local_268;
        uVar48 = local_268._1_1_;
        uVar49 = local_268._2_1_;
        bVar50 = local_268._3_1_;
        uVar51 = local_268._4_1_;
        uVar52 = local_268._5_1_;
        uVar53 = local_268._6_1_;
        bVar16 = local_268._7_1_;
        uVar54 = uStack_260;
        uVar55 = uStack_25f;
        uVar56 = uStack_25e;
        bVar57 = bStack_25d;
        uVar58 = uStack_25c;
        uVar59 = uStack_25b;
        uVar60 = uStack_25a;
        bVar61 = bStack_259;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & bVar15) == 0) break;
      psVar9 = ((group_type_pointer)psVar20)->m;
      psVar20 = ((group_type_pointer)psVar20)->m + 1;
      pbVar25 = (pointer)((ulong)((long)&(pbVar25->_M_dataplus)._M_p + (long)(psVar9 + 1)) &
                         ppoptions.ignoreDirectives.table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_size_mask);
    } while (psVar20 <=
             ppoptions.ignoreDirectives.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
             .arrays.groups_size_mask);
    if (ppoptions.ignoreDirectives.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.size <
        ppoptions.ignoreDirectives.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)&loptions,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)&ppoptions.ignoreDirectives,(size_t)pbVar33,uVar18,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_2b0);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)&loptions,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)&ppoptions.ignoreDirectives,uVar18,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_2b0);
    }
LAB_0017a5e4:
    pbVar25 = local_298 + 1;
  }
  parsing::LexerOptions::LexerOptions(&loptions);
  loptions.languageVersion = this->languageVersion;
  loptions.enableLegacyProtect =
       (bool)((this->options).enableLegacyProtect.super__Optional_base<bool,_true,_true>._M_payload.
              super__Optional_payload_base<bool>._M_payload._M_value != false &
             (this->options).enableLegacyProtect.super__Optional_base<bool,_true,_true>._M_payload.
             super__Optional_payload_base<bool>._M_engaged);
  if ((this->options).maxLexerErrors.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    loptions.maxErrors =
         (this->options).maxLexerErrors.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload._M_value;
  }
  if (loptions.enableLegacyProtect != false) {
    local_248._M_len = 6;
    local_248._M_str = "pragma";
    pgVar19 = (group_type_pointer)detail::hashing::hash("pragma",6);
    pcVar31 = (pointer)((ulong)pgVar19 >>
                       ((byte)loptions.commentHandlers.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                              .arrays.groups_size_index & 0x3f));
    lVar27 = ((ulong)pgVar19 & 0xff) * 4;
    uVar47 = (&UNK_0040c7ac)[lVar27];
    uVar48 = (&UNK_0040c7ad)[lVar27];
    uVar49 = (&UNK_0040c7ae)[lVar27];
    bVar50 = (&UNK_0040c7af)[lVar27];
    pbVar33 = (pointer)(ulong)((uint)pgVar19 & 7);
    pbVar25 = (pointer)0x0;
    pcVar26 = pcVar31;
    uVar51 = uVar47;
    uVar52 = uVar48;
    uVar53 = uVar49;
    bVar16 = bVar50;
    uVar54 = uVar47;
    uVar55 = uVar48;
    uVar56 = uVar49;
    bVar57 = bVar50;
    uVar58 = uVar47;
    uVar59 = uVar48;
    uVar60 = uVar49;
    bVar61 = bVar50;
    do {
      ppVar11 = loptions.commentHandlers.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                .arrays.elements_;
      pgVar10 = loptions.commentHandlers.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                .arrays.groups_;
      pgVar1 = loptions.commentHandlers.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
               .arrays.groups_ + (long)pcVar26;
      local_f8 = pgVar1->m[0].n;
      uStack_f7 = pgVar1->m[1].n;
      uStack_f6 = pgVar1->m[2].n;
      bStack_f5 = pgVar1->m[3].n;
      uStack_f4 = pgVar1->m[4].n;
      uStack_f3 = pgVar1->m[5].n;
      uStack_f2 = pgVar1->m[6].n;
      bStack_f1 = pgVar1->m[7].n;
      uStack_f0 = pgVar1->m[8].n;
      uStack_ef = pgVar1->m[9].n;
      uStack_ee = pgVar1->m[10].n;
      bStack_ed = pgVar1->m[0xb].n;
      uStack_ec = pgVar1->m[0xc].n;
      uStack_eb = pgVar1->m[0xd].n;
      uStack_ea = pgVar1->m[0xe].n;
      bVar15 = pgVar1->m[0xf].n;
      auVar35[0] = -(local_f8 == uVar47);
      auVar35[1] = -(uStack_f7 == uVar48);
      auVar35[2] = -(uStack_f6 == uVar49);
      auVar35[3] = -(bStack_f5 == bVar50);
      auVar35[4] = -(uStack_f4 == uVar51);
      auVar35[5] = -(uStack_f3 == uVar52);
      auVar35[6] = -(uStack_f2 == uVar53);
      auVar35[7] = -(bStack_f1 == bVar16);
      auVar35[8] = -(uStack_f0 == uVar54);
      auVar35[9] = -(uStack_ef == uVar55);
      auVar35[10] = -(uStack_ee == uVar56);
      auVar35[0xb] = -(bStack_ed == bVar57);
      auVar35[0xc] = -(uStack_ec == uVar58);
      auVar35[0xd] = -(uStack_eb == uVar59);
      auVar35[0xe] = -(uStack_ea == uVar60);
      auVar35[0xf] = -(bVar15 == bVar61);
      uVar17 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe);
      bStack_e9 = bVar15;
      if (uVar17 != 0) {
        local_298._0_2_ = CONCAT11(uVar48,uVar47);
        local_298._0_3_ = CONCAT12(uVar49,(undefined2)local_298);
        local_298._0_4_ = CONCAT13(bVar50,(undefined3)local_298);
        local_298._0_5_ = CONCAT14(uVar51,(undefined4)local_298);
        local_298._0_6_ = CONCAT15(uVar52,(undefined5)local_298);
        local_298._0_7_ = CONCAT16(uVar53,(undefined6)local_298);
        local_298 = (pointer)CONCAT17(bVar16,(undefined7)local_298);
        local_2c0 = pgVar19;
        local_2b8 = pbVar25;
        uStack_290 = uVar54;
        uStack_28f = uVar55;
        uStack_28e = uVar56;
        bStack_28d = bVar57;
        uStack_28c = uVar58;
        uStack_28b = uVar59;
        uStack_28a = uVar60;
        bStack_289 = bVar61;
        local_278 = pbVar33;
        local_268 = pcVar26;
        do {
          iVar7 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
            }
          }
          ppVar23 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                     *)((long)&ppVar11[(long)pcVar26 * 0xf].first._M_len + (ulong)(uint)(iVar7 << 6)
                       );
          bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              &loptions,&local_248,
                              (basic_string_view<char,_std::char_traits<char>_> *)ppVar23);
          if (bVar14) goto LAB_0017a7e9;
          uVar17 = uVar17 - 1 & uVar17;
        } while (uVar17 != 0);
        bVar15 = pgVar10[(long)pcVar26].m[0xf].n;
        pgVar19 = local_2c0;
        pbVar25 = local_2b8;
        pcVar26 = local_268;
        pbVar33 = local_278;
        uVar47 = (uchar)local_298;
        uVar48 = local_298._1_1_;
        uVar49 = local_298._2_1_;
        bVar50 = local_298._3_1_;
        uVar51 = local_298._4_1_;
        uVar52 = local_298._5_1_;
        uVar53 = local_298._6_1_;
        bVar16 = local_298._7_1_;
        uVar54 = uStack_290;
        uVar55 = uStack_28f;
        uVar56 = uStack_28e;
        bVar57 = bStack_28d;
        uVar58 = uStack_28c;
        uVar59 = uStack_28b;
        uVar60 = uStack_28a;
        bVar61 = bStack_289;
      }
      if ((*(byte *)&pbVar33[0x2065d]._M_dataplus._M_p & bVar15) == 0) break;
      pcVar26 = pcVar26 + (long)pbVar25;
      pbVar25 = (pointer)((long)&(pbVar25->_M_dataplus)._M_p + 1);
      pcVar26 = (pointer)((ulong)(pcVar26 + 1) &
                         loptions.commentHandlers.table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                         .arrays.groups_size_mask);
    } while (pbVar25 <=
             loptions.commentHandlers.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
             .arrays.groups_size_mask);
    if (loptions.commentHandlers.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
        .size_ctrl.size <
        loptions.commentHandlers.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_2b0,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                  *)&loptions,(size_t)pcVar31,(size_t)pgVar19,(try_emplace_args_t *)&local_288,
                 &local_248);
      ppVar23 = local_2a0;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_2b0,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                  *)&loptions,(size_t)pgVar19,(try_emplace_args_t *)&local_288,&local_248);
      ppVar23 = local_2a0;
    }
LAB_0017a7e9:
    pbVar25 = (pointer)&ppVar23->second;
    local_288._M_len = 7;
    local_288._M_str = "protect";
    pbVar33 = (pointer)detail::hashing::hash("protect",7);
    pbVar21 = (pointer)((ulong)pbVar33 >>
                       ((byte)(ppVar23->second).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                              .arrays.groups_size_index & 0x3f));
    lVar27 = ((ulong)pbVar33 & 0xff) * 4;
    uVar47 = (&UNK_0040c7ac)[lVar27];
    uVar48 = (&UNK_0040c7ad)[lVar27];
    uVar49 = (&UNK_0040c7ae)[lVar27];
    bVar50 = (&UNK_0040c7af)[lVar27];
    pbVar30 = (pointer)(ulong)((uint)pbVar33 & 7);
    psVar20 = (slot_type *)0x0;
    pbVar29 = pbVar21;
    uVar51 = uVar47;
    uVar52 = uVar48;
    uVar53 = uVar49;
    bVar16 = bVar50;
    uVar54 = uVar47;
    uVar55 = uVar48;
    uVar56 = uVar49;
    bVar57 = bVar50;
    uVar58 = uVar47;
    uVar59 = uVar48;
    uVar60 = uVar49;
    bVar61 = bVar50;
    do {
      pgVar3 = (ppVar23->second).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
               .arrays.groups_;
      pgVar19 = pgVar3 + (long)pbVar29;
      local_108 = pgVar19->m[0].n;
      uStack_107 = pgVar19->m[1].n;
      uStack_106 = pgVar19->m[2].n;
      bStack_105 = pgVar19->m[3].n;
      uStack_104 = pgVar19->m[4].n;
      uStack_103 = pgVar19->m[5].n;
      uStack_102 = pgVar19->m[6].n;
      bStack_101 = pgVar19->m[7].n;
      uStack_100 = pgVar19->m[8].n;
      uStack_ff = pgVar19->m[9].n;
      uStack_fe = pgVar19->m[10].n;
      bStack_fd = pgVar19->m[0xb].n;
      uStack_fc = pgVar19->m[0xc].n;
      uStack_fb = pgVar19->m[0xd].n;
      uStack_fa = pgVar19->m[0xe].n;
      bVar15 = pgVar19->m[0xf].n;
      auVar36[0] = -(local_108 == uVar47);
      auVar36[1] = -(uStack_107 == uVar48);
      auVar36[2] = -(uStack_106 == uVar49);
      auVar36[3] = -(bStack_105 == bVar50);
      auVar36[4] = -(uStack_104 == uVar51);
      auVar36[5] = -(uStack_103 == uVar52);
      auVar36[6] = -(uStack_102 == uVar53);
      auVar36[7] = -(bStack_101 == bVar16);
      auVar36[8] = -(uStack_100 == uVar54);
      auVar36[9] = -(uStack_ff == uVar55);
      auVar36[10] = -(uStack_fe == uVar56);
      auVar36[0xb] = -(bStack_fd == bVar57);
      auVar36[0xc] = -(uStack_fc == uVar58);
      auVar36[0xd] = -(uStack_fb == uVar59);
      auVar36[0xe] = -(uStack_fa == uVar60);
      auVar36[0xf] = -(bVar15 == bVar61);
      uVar17 = (uint)(ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe);
      bStack_f9 = bVar15;
      if (uVar17 != 0) {
        local_268._0_2_ = CONCAT11(uVar48,uVar47);
        local_268._0_3_ = CONCAT12(uVar49,(undefined2)local_268);
        local_268._0_4_ = CONCAT13(bVar50,(undefined3)local_268);
        local_268._0_5_ = CONCAT14(uVar51,(undefined4)local_268);
        local_268._0_6_ = CONCAT15(uVar52,(undefined5)local_268);
        local_268._0_7_ = CONCAT16(uVar53,(undefined6)local_268);
        local_268 = (pointer)CONCAT17(bVar16,(undefined7)local_268);
        ppVar4 = (ppVar23->second).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                 .arrays.elements_;
        local_2c0 = (group_type_pointer)psVar20;
        local_2b8 = pbVar33;
        local_298 = pbVar25;
        local_278 = pbVar29;
        uStack_260 = uVar54;
        uStack_25f = uVar55;
        uStack_25e = uVar56;
        bStack_25d = bVar57;
        uStack_25c = uVar58;
        uStack_25b = uVar59;
        uStack_25a = uVar60;
        bStack_259 = bVar61;
        local_250 = pbVar30;
        do {
          uVar8 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
          ppVar24 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                     *)(ppVar4 + (long)pbVar29 * 0xf + (ulong)uVar8);
          bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              local_298,&local_288,
                              (basic_string_view<char,_std::char_traits<char>_> *)ppVar24);
          if (bVar14) goto LAB_0017a962;
          uVar17 = uVar17 - 1 & uVar17;
        } while (uVar17 != 0);
        bVar15 = pgVar3[(long)pbVar29].m[0xf].n;
        pbVar33 = local_2b8;
        pbVar25 = local_298;
        psVar20 = local_2c0->m;
        pbVar29 = local_278;
        pbVar30 = local_250;
        uVar47 = (uchar)local_268;
        uVar48 = local_268._1_1_;
        uVar49 = local_268._2_1_;
        bVar50 = local_268._3_1_;
        uVar51 = local_268._4_1_;
        uVar52 = local_268._5_1_;
        uVar53 = local_268._6_1_;
        bVar16 = local_268._7_1_;
        uVar54 = uStack_260;
        uVar55 = uStack_25f;
        uVar56 = uStack_25e;
        bVar57 = bStack_25d;
        uVar58 = uStack_25c;
        uVar59 = uStack_25b;
        uVar60 = uStack_25a;
        bVar61 = bStack_259;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(long)pbVar30] & bVar15) == 0) break;
      puVar5 = (undefined1 *)
               (ppVar23->second).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
               .arrays.groups_size_mask;
      psVar9 = ((group_type_pointer)psVar20)->m;
      psVar20 = ((group_type_pointer)psVar20)->m + 1;
      pbVar29 = (pointer)((ulong)((long)&(pbVar29->_M_dataplus)._M_p + (long)(psVar9 + 1)) &
                         (ulong)puVar5);
    } while (psVar20 <= puVar5);
    if ((ppVar23->second).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
        .size_ctrl.size <
        (ppVar23->second).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_2b0,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                  *)pbVar25,(size_t)pbVar21,(size_t)pbVar33,&local_2c1,&local_288);
      ppVar24 = local_2a0;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_2b0,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                  *)pbVar25,(size_t)pbVar33,&local_2c1,&local_288);
      ppVar24 = local_2a0;
    }
LAB_0017a962:
    *(undefined4 *)
     &(ppVar24->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .arrays.groups_size_index = 0;
    (ppVar24->second).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
    .arrays.groups_size_mask = 0;
    (ppVar24->second).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
    .arrays.groups_ = (group_type_pointer)0x0;
  }
  local_250 = (pointer)(this->translateOffFormats).
                       super__Vector_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  pbVar25 = (pointer)(this->translateOffFormats).
                     super__Vector_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar25 != local_250) {
    pbVar33 = pbVar25 + 1;
    local_298 = (pointer)&pbVar25->field_2;
    local_268 = (pbVar25->_M_dataplus)._M_p;
    local_2c0 = (group_type_pointer)pbVar25->_M_string_length;
    local_2b8 = pbVar25;
    uVar18 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                        &loptions,(basic_string_view<char,_std::char_traits<char>_> *)pbVar33);
    uVar32 = uVar18 >> ((byte)loptions.commentHandlers.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                              .arrays.groups_size_index & 0x3f);
    lVar27 = (uVar18 & 0xff) * 4;
    uVar47 = (&UNK_0040c7ac)[lVar27];
    uVar48 = (&UNK_0040c7ad)[lVar27];
    uVar49 = (&UNK_0040c7ae)[lVar27];
    bVar50 = (&UNK_0040c7af)[lVar27];
    uVar22 = 0;
    uVar28 = uVar32;
    do {
      ppVar11 = loptions.commentHandlers.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                .arrays.elements_;
      pgVar10 = loptions.commentHandlers.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                .arrays.groups_;
      pgVar1 = loptions.commentHandlers.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
               .arrays.groups_ + uVar28;
      local_118 = pgVar1->m[0].n;
      uStack_117 = pgVar1->m[1].n;
      uStack_116 = pgVar1->m[2].n;
      bStack_115 = pgVar1->m[3].n;
      uStack_114 = pgVar1->m[4].n;
      uStack_113 = pgVar1->m[5].n;
      uStack_112 = pgVar1->m[6].n;
      bStack_111 = pgVar1->m[7].n;
      uStack_110 = pgVar1->m[8].n;
      uStack_10f = pgVar1->m[9].n;
      uStack_10e = pgVar1->m[10].n;
      bStack_10d = pgVar1->m[0xb].n;
      uStack_10c = pgVar1->m[0xc].n;
      uStack_10b = pgVar1->m[0xd].n;
      uStack_10a = pgVar1->m[0xe].n;
      bVar16 = pgVar1->m[0xf].n;
      auVar37[0] = -(local_118 == uVar47);
      auVar37[1] = -(uStack_117 == uVar48);
      auVar37[2] = -(uStack_116 == uVar49);
      auVar37[3] = -(bStack_115 == bVar50);
      auVar37[4] = -(uStack_114 == uVar47);
      auVar37[5] = -(uStack_113 == uVar48);
      auVar37[6] = -(uStack_112 == uVar49);
      auVar37[7] = -(bStack_111 == bVar50);
      auVar37[8] = -(uStack_110 == uVar47);
      auVar37[9] = -(uStack_10f == uVar48);
      auVar37[10] = -(uStack_10e == uVar49);
      auVar37[0xb] = -(bStack_10d == bVar50);
      auVar37[0xc] = -(uStack_10c == uVar47);
      auVar37[0xd] = -(uStack_10b == uVar48);
      auVar37[0xe] = -(uStack_10a == uVar49);
      auVar37[0xf] = -(bVar16 == bVar50);
      uVar17 = (uint)(ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe);
      bStack_109 = bVar16;
      if (uVar17 != 0) {
        do {
          local_278 = pbVar33;
          iVar7 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
            }
          }
          ppVar23 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                     *)((long)&ppVar11[uVar28 * 0xf].first._M_len + (ulong)(uint)(iVar7 << 6));
          bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              &loptions,
                              (basic_string_view<char,_std::char_traits<char>_> *)local_278,
                              (basic_string_view<char,_std::char_traits<char>_> *)ppVar23);
          if (bVar14) goto LAB_0017ab39;
          uVar17 = uVar17 - 1 & uVar17;
          pbVar33 = local_278;
        } while (uVar17 != 0);
        bVar16 = pgVar10[uVar28].m[0xf].n;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & bVar16) == 0) break;
      lVar27 = uVar28 + uVar22;
      uVar22 = uVar22 + 1;
      uVar28 = lVar27 + 1U &
               loptions.commentHandlers.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
               .arrays.groups_size_mask;
    } while (uVar22 <= loptions.commentHandlers.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                       .arrays.groups_size_mask);
    if (loptions.commentHandlers.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
        .size_ctrl.size <
        loptions.commentHandlers.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                ((locator *)local_2b0,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                  *)&loptions,uVar32,uVar18,(try_emplace_args_t *)&local_248,
                 (basic_string_view<char,_std::char_traits<char>_> *)pbVar33);
      ppVar23 = local_2a0;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                ((locator *)local_2b0,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                  *)&loptions,uVar18,(try_emplace_args_t *)&local_248,
                 (basic_string_view<char,_std::char_traits<char>_> *)pbVar33);
      ppVar23 = local_2a0;
    }
LAB_0017ab39:
    pbVar25 = local_298;
    this_00 = &ppVar23->second;
    uVar18 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_00
                        ,(basic_string_view<char,_std::char_traits<char>_> *)local_298);
    uVar28 = uVar18 >> ((byte)(ppVar23->second).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                              .arrays.groups_size_index & 0x3f);
    lVar27 = (uVar18 & 0xff) * 4;
    uVar47 = (&UNK_0040c7ac)[lVar27];
    uVar48 = (&UNK_0040c7ad)[lVar27];
    uVar49 = (&UNK_0040c7ae)[lVar27];
    bVar50 = (&UNK_0040c7af)[lVar27];
    uVar32 = 0;
    uVar22 = uVar28;
    uVar51 = uVar47;
    uVar52 = uVar48;
    uVar53 = uVar49;
    bVar16 = bVar50;
    uVar54 = uVar47;
    uVar55 = uVar48;
    uVar56 = uVar49;
    bVar57 = bVar50;
    uVar58 = uVar47;
    uVar59 = uVar48;
    uVar60 = uVar49;
    bVar61 = bVar50;
    do {
      pgVar3 = (ppVar23->second).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
               .arrays.groups_;
      pgVar19 = pgVar3 + uVar22;
      local_128 = pgVar19->m[0].n;
      uStack_127 = pgVar19->m[1].n;
      uStack_126 = pgVar19->m[2].n;
      bStack_125 = pgVar19->m[3].n;
      uStack_124 = pgVar19->m[4].n;
      uStack_123 = pgVar19->m[5].n;
      uStack_122 = pgVar19->m[6].n;
      bStack_121 = pgVar19->m[7].n;
      uStack_120 = pgVar19->m[8].n;
      uStack_11f = pgVar19->m[9].n;
      uStack_11e = pgVar19->m[10].n;
      bStack_11d = pgVar19->m[0xb].n;
      uStack_11c = pgVar19->m[0xc].n;
      uStack_11b = pgVar19->m[0xd].n;
      uStack_11a = pgVar19->m[0xe].n;
      bVar15 = pgVar19->m[0xf].n;
      auVar38[0] = -(local_128 == uVar47);
      auVar38[1] = -(uStack_127 == uVar48);
      auVar38[2] = -(uStack_126 == uVar49);
      auVar38[3] = -(bStack_125 == bVar50);
      auVar38[4] = -(uStack_124 == uVar51);
      auVar38[5] = -(uStack_123 == uVar52);
      auVar38[6] = -(uStack_122 == uVar53);
      auVar38[7] = -(bStack_121 == bVar16);
      auVar38[8] = -(uStack_120 == uVar54);
      auVar38[9] = -(uStack_11f == uVar55);
      auVar38[10] = -(uStack_11e == uVar56);
      auVar38[0xb] = -(bStack_11d == bVar57);
      auVar38[0xc] = -(uStack_11c == uVar58);
      auVar38[0xd] = -(uStack_11b == uVar59);
      auVar38[0xe] = -(uStack_11a == uVar60);
      auVar38[0xf] = -(bVar15 == bVar61);
      uVar17 = (uint)(ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe);
      bStack_119 = bVar15;
      if (uVar17 != 0) {
        local_278 = (pointer)CONCAT17(bVar16,CONCAT16(uVar53,CONCAT15(uVar52,CONCAT14(uVar51,
                                                  CONCAT13(bVar50,CONCAT12(uVar49,CONCAT11(uVar48,
                                                  uVar47)))))));
        ppVar4 = (ppVar23->second).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                 .arrays.elements_;
        uStack_270 = uVar54;
        uStack_26f = uVar55;
        uStack_26e = uVar56;
        bStack_26d = bVar57;
        uStack_26c = uVar58;
        uStack_26b = uVar59;
        uStack_26a = uVar60;
        bStack_269 = bVar61;
        local_1b0 = uVar28;
        do {
          uVar8 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
          ppVar24 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                     *)(ppVar4 + uVar22 * 0xf + (ulong)uVar8);
          bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              this_00,(basic_string_view<char,_std::char_traits<char>_> *)local_298,
                              (basic_string_view<char,_std::char_traits<char>_> *)ppVar24);
          if (bVar14) goto LAB_0017acae;
          uVar17 = uVar17 - 1 & uVar17;
        } while (uVar17 != 0);
        bVar15 = pgVar3[uVar22].m[0xf].n;
        uVar28 = local_1b0;
        pbVar25 = local_298;
        uVar47 = (uchar)local_278;
        uVar48 = local_278._1_1_;
        uVar49 = local_278._2_1_;
        bVar50 = local_278._3_1_;
        uVar51 = local_278._4_1_;
        uVar52 = local_278._5_1_;
        uVar53 = local_278._6_1_;
        bVar16 = local_278._7_1_;
        uVar54 = uStack_270;
        uVar55 = uStack_26f;
        uVar56 = uStack_26e;
        bVar57 = bStack_26d;
        uVar58 = uStack_26c;
        uVar59 = uStack_26b;
        uVar60 = uStack_26a;
        bVar61 = bStack_269;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & bVar15) == 0) break;
      uVar6 = (ppVar23->second).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
              .arrays.groups_size_mask;
      uVar22 = uVar32 + uVar22 + 1;
      uVar32 = uVar32 + 1;
      uVar22 = uVar22 & uVar6;
    } while (uVar32 <= uVar6);
    if ((ppVar23->second).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
        .size_ctrl.size <
        (ppVar23->second).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                ((locator *)local_2b0,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                  *)this_00,uVar28,uVar18,(try_emplace_args_t *)&local_248,
                 (basic_string_view<char,_std::char_traits<char>_> *)pbVar25);
      ppVar24 = local_2a0;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                ((locator *)local_2b0,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                  *)this_00,uVar18,(try_emplace_args_t *)&local_248,
                 (basic_string_view<char,_std::char_traits<char>_> *)pbVar25);
      ppVar24 = local_2a0;
    }
LAB_0017acae:
    *(undefined4 *)
     &(ppVar24->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .arrays.groups_size_index = 1;
    (ppVar24->second).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
    .arrays.groups_size_mask = (size_t)local_268;
    (ppVar24->second).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
    .arrays.groups_ = local_2c0;
    pbVar25 = (pointer)&local_2b8[1].field_2;
  }
  local_248._M_len = 5;
  local_248._M_str = "slang";
  pgVar19 = (group_type_pointer)detail::hashing::hash("slang",5);
  pcVar31 = (pointer)((ulong)pgVar19 >>
                     ((byte)loptions.commentHandlers.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                            .arrays.groups_size_index & 0x3f));
  lVar27 = ((ulong)pgVar19 & 0xff) * 4;
  uVar47 = (&UNK_0040c7ac)[lVar27];
  uVar48 = (&UNK_0040c7ad)[lVar27];
  uVar49 = (&UNK_0040c7ae)[lVar27];
  bVar50 = (&UNK_0040c7af)[lVar27];
  pbVar33 = (pointer)(ulong)((uint)pgVar19 & 7);
  pbVar25 = (pointer)0x0;
  pcVar26 = pcVar31;
  uVar51 = uVar47;
  uVar52 = uVar48;
  uVar53 = uVar49;
  bVar16 = bVar50;
  uVar54 = uVar47;
  uVar55 = uVar48;
  uVar56 = uVar49;
  bVar57 = bVar50;
  uVar58 = uVar47;
  uVar59 = uVar48;
  uVar60 = uVar49;
  bVar61 = bVar50;
  do {
    ppVar11 = loptions.commentHandlers.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
              .arrays.elements_;
    pgVar10 = loptions.commentHandlers.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
              .arrays.groups_;
    pgVar1 = loptions.commentHandlers.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
             .arrays.groups_ + (long)pcVar26;
    local_138 = pgVar1->m[0].n;
    uStack_137 = pgVar1->m[1].n;
    uStack_136 = pgVar1->m[2].n;
    bStack_135 = pgVar1->m[3].n;
    uStack_134 = pgVar1->m[4].n;
    uStack_133 = pgVar1->m[5].n;
    uStack_132 = pgVar1->m[6].n;
    bStack_131 = pgVar1->m[7].n;
    uStack_130 = pgVar1->m[8].n;
    uStack_12f = pgVar1->m[9].n;
    uStack_12e = pgVar1->m[10].n;
    bStack_12d = pgVar1->m[0xb].n;
    uStack_12c = pgVar1->m[0xc].n;
    uStack_12b = pgVar1->m[0xd].n;
    uStack_12a = pgVar1->m[0xe].n;
    bVar15 = pgVar1->m[0xf].n;
    auVar39[0] = -(local_138 == uVar47);
    auVar39[1] = -(uStack_137 == uVar48);
    auVar39[2] = -(uStack_136 == uVar49);
    auVar39[3] = -(bStack_135 == bVar50);
    auVar39[4] = -(uStack_134 == uVar51);
    auVar39[5] = -(uStack_133 == uVar52);
    auVar39[6] = -(uStack_132 == uVar53);
    auVar39[7] = -(bStack_131 == bVar16);
    auVar39[8] = -(uStack_130 == uVar54);
    auVar39[9] = -(uStack_12f == uVar55);
    auVar39[10] = -(uStack_12e == uVar56);
    auVar39[0xb] = -(bStack_12d == bVar57);
    auVar39[0xc] = -(uStack_12c == uVar58);
    auVar39[0xd] = -(uStack_12b == uVar59);
    auVar39[0xe] = -(uStack_12a == uVar60);
    auVar39[0xf] = -(bVar15 == bVar61);
    uVar17 = (uint)(ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe);
    bStack_129 = bVar15;
    if (uVar17 != 0) {
      local_298._0_2_ = CONCAT11(uVar48,uVar47);
      local_298._0_3_ = CONCAT12(uVar49,(undefined2)local_298);
      local_298._0_4_ = CONCAT13(bVar50,(undefined3)local_298);
      local_298._0_5_ = CONCAT14(uVar51,(undefined4)local_298);
      local_298._0_6_ = CONCAT15(uVar52,(undefined5)local_298);
      local_298._0_7_ = CONCAT16(uVar53,(undefined6)local_298);
      local_298 = (pointer)CONCAT17(bVar16,(undefined7)local_298);
      local_2c0 = pgVar19;
      local_2b8 = pbVar25;
      uStack_290 = uVar54;
      uStack_28f = uVar55;
      uStack_28e = uVar56;
      bStack_28d = bVar57;
      uStack_28c = uVar58;
      uStack_28b = uVar59;
      uStack_28a = uVar60;
      bStack_289 = bVar61;
      local_278 = pbVar33;
      local_268 = pcVar26;
      do {
        iVar7 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
          }
        }
        ppVar23 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                   *)((long)&ppVar11[(long)pcVar26 * 0xf].first._M_len + (ulong)(uint)(iVar7 << 6));
        bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            &loptions,&local_248,
                            (basic_string_view<char,_std::char_traits<char>_> *)ppVar23);
        if (bVar14) goto LAB_0017ae98;
        uVar17 = uVar17 - 1 & uVar17;
      } while (uVar17 != 0);
      bVar15 = pgVar10[(long)pcVar26].m[0xf].n;
      pgVar19 = local_2c0;
      pbVar25 = local_2b8;
      pcVar26 = local_268;
      pbVar33 = local_278;
      uVar47 = (uchar)local_298;
      uVar48 = local_298._1_1_;
      uVar49 = local_298._2_1_;
      bVar50 = local_298._3_1_;
      uVar51 = local_298._4_1_;
      uVar52 = local_298._5_1_;
      uVar53 = local_298._6_1_;
      bVar16 = local_298._7_1_;
      uVar54 = uStack_290;
      uVar55 = uStack_28f;
      uVar56 = uStack_28e;
      bVar57 = bStack_28d;
      uVar58 = uStack_28c;
      uVar59 = uStack_28b;
      uVar60 = uStack_28a;
      bVar61 = bStack_289;
    }
    if ((*(byte *)&pbVar33[0x2065d]._M_dataplus._M_p & bVar15) == 0) break;
    pcVar26 = pcVar26 + (long)pbVar25;
    pbVar25 = (pointer)((long)&(pbVar25->_M_dataplus)._M_p + 1);
    pcVar26 = (pointer)((ulong)(pcVar26 + 1) &
                       loptions.commentHandlers.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                       .arrays.groups_size_mask);
  } while (pbVar25 <=
           loptions.commentHandlers.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
           .arrays.groups_size_mask);
  if (loptions.commentHandlers.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
      .size_ctrl.size <
      loptions.commentHandlers.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&loptions,(size_t)pcVar31,(size_t)pgVar19,(try_emplace_args_t *)&local_288,
               &local_248);
    ppVar23 = local_2a0;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&loptions,(size_t)pgVar19,(try_emplace_args_t *)&local_288,&local_248);
    ppVar23 = local_2a0;
  }
LAB_0017ae98:
  pbVar25 = (pointer)&ppVar23->second;
  local_288._M_len = 8;
  local_288._M_str = "lint_off";
  pbVar33 = (pointer)detail::hashing::hash("lint_off",8);
  pbVar21 = (pointer)((ulong)pbVar33 >>
                     ((byte)(ppVar23->second).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                            .arrays.groups_size_index & 0x3f));
  lVar27 = ((ulong)pbVar33 & 0xff) * 4;
  uVar47 = (&UNK_0040c7ac)[lVar27];
  uVar48 = (&UNK_0040c7ad)[lVar27];
  uVar49 = (&UNK_0040c7ae)[lVar27];
  bVar50 = (&UNK_0040c7af)[lVar27];
  pbVar30 = (pointer)(ulong)((uint)pbVar33 & 7);
  psVar20 = (slot_type *)0x0;
  pbVar29 = pbVar21;
  uVar51 = uVar47;
  uVar52 = uVar48;
  uVar53 = uVar49;
  bVar16 = bVar50;
  uVar54 = uVar47;
  uVar55 = uVar48;
  uVar56 = uVar49;
  bVar57 = bVar50;
  uVar58 = uVar47;
  uVar59 = uVar48;
  uVar60 = uVar49;
  bVar61 = bVar50;
  do {
    pgVar3 = (ppVar23->second).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
             .arrays.groups_;
    pgVar19 = pgVar3 + (long)pbVar29;
    local_148 = pgVar19->m[0].n;
    uStack_147 = pgVar19->m[1].n;
    uStack_146 = pgVar19->m[2].n;
    bStack_145 = pgVar19->m[3].n;
    uStack_144 = pgVar19->m[4].n;
    uStack_143 = pgVar19->m[5].n;
    uStack_142 = pgVar19->m[6].n;
    bStack_141 = pgVar19->m[7].n;
    uStack_140 = pgVar19->m[8].n;
    uStack_13f = pgVar19->m[9].n;
    uStack_13e = pgVar19->m[10].n;
    bStack_13d = pgVar19->m[0xb].n;
    uStack_13c = pgVar19->m[0xc].n;
    uStack_13b = pgVar19->m[0xd].n;
    uStack_13a = pgVar19->m[0xe].n;
    bVar15 = pgVar19->m[0xf].n;
    auVar40[0] = -(local_148 == uVar47);
    auVar40[1] = -(uStack_147 == uVar48);
    auVar40[2] = -(uStack_146 == uVar49);
    auVar40[3] = -(bStack_145 == bVar50);
    auVar40[4] = -(uStack_144 == uVar51);
    auVar40[5] = -(uStack_143 == uVar52);
    auVar40[6] = -(uStack_142 == uVar53);
    auVar40[7] = -(bStack_141 == bVar16);
    auVar40[8] = -(uStack_140 == uVar54);
    auVar40[9] = -(uStack_13f == uVar55);
    auVar40[10] = -(uStack_13e == uVar56);
    auVar40[0xb] = -(bStack_13d == bVar57);
    auVar40[0xc] = -(uStack_13c == uVar58);
    auVar40[0xd] = -(uStack_13b == uVar59);
    auVar40[0xe] = -(uStack_13a == uVar60);
    auVar40[0xf] = -(bVar15 == bVar61);
    uVar17 = (uint)(ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe);
    bStack_139 = bVar15;
    if (uVar17 != 0) {
      local_268._0_2_ = CONCAT11(uVar48,uVar47);
      local_268._0_3_ = CONCAT12(uVar49,(undefined2)local_268);
      local_268._0_4_ = CONCAT13(bVar50,(undefined3)local_268);
      local_268._0_5_ = CONCAT14(uVar51,(undefined4)local_268);
      local_268._0_6_ = CONCAT15(uVar52,(undefined5)local_268);
      local_268._0_7_ = CONCAT16(uVar53,(undefined6)local_268);
      local_268 = (pointer)CONCAT17(bVar16,(undefined7)local_268);
      ppVar4 = (ppVar23->second).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
               .arrays.elements_;
      local_2c0 = (group_type_pointer)psVar20;
      local_2b8 = pbVar33;
      local_298 = pbVar25;
      local_278 = pbVar29;
      uStack_260 = uVar54;
      uStack_25f = uVar55;
      uStack_25e = uVar56;
      bStack_25d = bVar57;
      uStack_25c = uVar58;
      uStack_25b = uVar59;
      uStack_25a = uVar60;
      bStack_259 = bVar61;
      local_250 = pbVar30;
      do {
        uVar8 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        ppVar24 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                   *)(ppVar4 + (long)pbVar29 * 0xf + (ulong)uVar8);
        bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_298,&local_288,
                            (basic_string_view<char,_std::char_traits<char>_> *)ppVar24);
        if (bVar14) goto LAB_0017b018;
        uVar17 = uVar17 - 1 & uVar17;
      } while (uVar17 != 0);
      bVar15 = pgVar3[(long)pbVar29].m[0xf].n;
      pbVar33 = local_2b8;
      psVar20 = local_2c0->m;
      pbVar29 = local_278;
      pbVar30 = local_250;
      pbVar25 = local_298;
      uVar47 = (uchar)local_268;
      uVar48 = local_268._1_1_;
      uVar49 = local_268._2_1_;
      bVar50 = local_268._3_1_;
      uVar51 = local_268._4_1_;
      uVar52 = local_268._5_1_;
      uVar53 = local_268._6_1_;
      bVar16 = local_268._7_1_;
      uVar54 = uStack_260;
      uVar55 = uStack_25f;
      uVar56 = uStack_25e;
      bVar57 = bStack_25d;
      uVar58 = uStack_25c;
      uVar59 = uStack_25b;
      uVar60 = uStack_25a;
      bVar61 = bStack_259;
    }
    if ((*(byte *)&pbVar30[0x2065d]._M_dataplus._M_p & bVar15) == 0) break;
    puVar5 = (undefined1 *)
             (ppVar23->second).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
             .arrays.groups_size_mask;
    psVar9 = ((group_type_pointer)psVar20)->m;
    psVar20 = ((group_type_pointer)psVar20)->m + 1;
    pbVar29 = (pointer)((ulong)((long)&(pbVar29->_M_dataplus)._M_p + (long)(psVar9 + 1)) &
                       (ulong)puVar5);
  } while (psVar20 <= puVar5);
  if ((ppVar23->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .size_ctrl.size <
      (ppVar23->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                *)pbVar25,(size_t)pbVar21,(size_t)pbVar33,&local_2c1,&local_288);
    ppVar24 = local_2a0;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                *)pbVar25,(size_t)pbVar33,&local_2c1,&local_288);
    ppVar24 = local_2a0;
  }
LAB_0017b018:
  *(undefined4 *)
   &(ppVar24->second).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
    .arrays.groups_size_index = 3;
  (ppVar24->second).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  .arrays.groups_size_mask = 0;
  (ppVar24->second).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  local_248._M_len = 5;
  local_248._M_str = "slang";
  pgVar19 = (group_type_pointer)detail::hashing::hash("slang",5);
  pcVar31 = (pointer)((ulong)pgVar19 >>
                     ((byte)loptions.commentHandlers.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                            .arrays.groups_size_index & 0x3f));
  lVar27 = ((ulong)pgVar19 & 0xff) * 4;
  uVar47 = (&UNK_0040c7ac)[lVar27];
  uVar48 = (&UNK_0040c7ad)[lVar27];
  uVar49 = (&UNK_0040c7ae)[lVar27];
  bVar50 = (&UNK_0040c7af)[lVar27];
  pbVar33 = (pointer)(ulong)((uint)pgVar19 & 7);
  pbVar25 = (pointer)0x0;
  pcVar26 = pcVar31;
  uVar51 = uVar47;
  uVar52 = uVar48;
  uVar53 = uVar49;
  bVar16 = bVar50;
  uVar54 = uVar47;
  uVar55 = uVar48;
  uVar56 = uVar49;
  bVar57 = bVar50;
  uVar58 = uVar47;
  uVar59 = uVar48;
  uVar60 = uVar49;
  bVar61 = bVar50;
  do {
    ppVar11 = loptions.commentHandlers.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
              .arrays.elements_;
    pgVar10 = loptions.commentHandlers.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
              .arrays.groups_;
    pgVar1 = loptions.commentHandlers.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
             .arrays.groups_ + (long)pcVar26;
    local_158 = pgVar1->m[0].n;
    uStack_157 = pgVar1->m[1].n;
    uStack_156 = pgVar1->m[2].n;
    bStack_155 = pgVar1->m[3].n;
    uStack_154 = pgVar1->m[4].n;
    uStack_153 = pgVar1->m[5].n;
    uStack_152 = pgVar1->m[6].n;
    bStack_151 = pgVar1->m[7].n;
    uStack_150 = pgVar1->m[8].n;
    uStack_14f = pgVar1->m[9].n;
    uStack_14e = pgVar1->m[10].n;
    bStack_14d = pgVar1->m[0xb].n;
    uStack_14c = pgVar1->m[0xc].n;
    uStack_14b = pgVar1->m[0xd].n;
    uStack_14a = pgVar1->m[0xe].n;
    bVar15 = pgVar1->m[0xf].n;
    auVar41[0] = -(local_158 == uVar47);
    auVar41[1] = -(uStack_157 == uVar48);
    auVar41[2] = -(uStack_156 == uVar49);
    auVar41[3] = -(bStack_155 == bVar50);
    auVar41[4] = -(uStack_154 == uVar51);
    auVar41[5] = -(uStack_153 == uVar52);
    auVar41[6] = -(uStack_152 == uVar53);
    auVar41[7] = -(bStack_151 == bVar16);
    auVar41[8] = -(uStack_150 == uVar54);
    auVar41[9] = -(uStack_14f == uVar55);
    auVar41[10] = -(uStack_14e == uVar56);
    auVar41[0xb] = -(bStack_14d == bVar57);
    auVar41[0xc] = -(uStack_14c == uVar58);
    auVar41[0xd] = -(uStack_14b == uVar59);
    auVar41[0xe] = -(uStack_14a == uVar60);
    auVar41[0xf] = -(bVar15 == bVar61);
    uVar17 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe);
    bStack_149 = bVar15;
    if (uVar17 != 0) {
      local_298._0_2_ = CONCAT11(uVar48,uVar47);
      local_298._0_3_ = CONCAT12(uVar49,(undefined2)local_298);
      local_298._0_4_ = CONCAT13(bVar50,(undefined3)local_298);
      local_298._0_5_ = CONCAT14(uVar51,(undefined4)local_298);
      local_298._0_6_ = CONCAT15(uVar52,(undefined5)local_298);
      local_298._0_7_ = CONCAT16(uVar53,(undefined6)local_298);
      local_298 = (pointer)CONCAT17(bVar16,(undefined7)local_298);
      local_2c0 = pgVar19;
      local_2b8 = pbVar25;
      uStack_290 = uVar54;
      uStack_28f = uVar55;
      uStack_28e = uVar56;
      bStack_28d = bVar57;
      uStack_28c = uVar58;
      uStack_28b = uVar59;
      uStack_28a = uVar60;
      bStack_289 = bVar61;
      local_278 = pbVar33;
      local_268 = pcVar26;
      do {
        iVar7 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
          }
        }
        ppVar23 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                   *)((long)&ppVar11[(long)pcVar26 * 0xf].first._M_len + (ulong)(uint)(iVar7 << 6));
        bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            &loptions,&local_248,
                            (basic_string_view<char,_std::char_traits<char>_> *)ppVar23);
        if (bVar14) goto LAB_0017b1ab;
        uVar17 = uVar17 - 1 & uVar17;
      } while (uVar17 != 0);
      bVar15 = pgVar10[(long)pcVar26].m[0xf].n;
      pgVar19 = local_2c0;
      pbVar25 = local_2b8;
      pcVar26 = local_268;
      pbVar33 = local_278;
      uVar47 = (uchar)local_298;
      uVar48 = local_298._1_1_;
      uVar49 = local_298._2_1_;
      bVar50 = local_298._3_1_;
      uVar51 = local_298._4_1_;
      uVar52 = local_298._5_1_;
      uVar53 = local_298._6_1_;
      bVar16 = local_298._7_1_;
      uVar54 = uStack_290;
      uVar55 = uStack_28f;
      uVar56 = uStack_28e;
      bVar57 = bStack_28d;
      uVar58 = uStack_28c;
      uVar59 = uStack_28b;
      uVar60 = uStack_28a;
      bVar61 = bStack_289;
    }
    if ((*(byte *)&pbVar33[0x2065d]._M_dataplus._M_p & bVar15) == 0) break;
    pcVar26 = pcVar26 + (long)pbVar25;
    pbVar25 = (pointer)((long)&(pbVar25->_M_dataplus)._M_p + 1);
    pcVar26 = (pointer)((ulong)(pcVar26 + 1) &
                       loptions.commentHandlers.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                       .arrays.groups_size_mask);
  } while (pbVar25 <=
           loptions.commentHandlers.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
           .arrays.groups_size_mask);
  if (loptions.commentHandlers.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
      .size_ctrl.size <
      loptions.commentHandlers.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&loptions,(size_t)pcVar31,(size_t)pgVar19,(try_emplace_args_t *)&local_288,
               &local_248);
    ppVar23 = local_2a0;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&loptions,(size_t)pgVar19,(try_emplace_args_t *)&local_288,&local_248);
    ppVar23 = local_2a0;
  }
LAB_0017b1ab:
  pbVar25 = (pointer)&ppVar23->second;
  local_288._M_len = 7;
  local_288._M_str = "lint_on";
  pbVar33 = (pointer)detail::hashing::hash("lint_on",7);
  pbVar21 = (pointer)((ulong)pbVar33 >>
                     ((byte)(ppVar23->second).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                            .arrays.groups_size_index & 0x3f));
  lVar27 = ((ulong)pbVar33 & 0xff) * 4;
  uVar47 = (&UNK_0040c7ac)[lVar27];
  uVar48 = (&UNK_0040c7ad)[lVar27];
  uVar49 = (&UNK_0040c7ae)[lVar27];
  bVar50 = (&UNK_0040c7af)[lVar27];
  pbVar30 = (pointer)(ulong)((uint)pbVar33 & 7);
  psVar20 = (slot_type *)0x0;
  pbVar29 = pbVar21;
  uVar51 = uVar47;
  uVar52 = uVar48;
  uVar53 = uVar49;
  bVar16 = bVar50;
  uVar54 = uVar47;
  uVar55 = uVar48;
  uVar56 = uVar49;
  bVar57 = bVar50;
  uVar58 = uVar47;
  uVar59 = uVar48;
  uVar60 = uVar49;
  bVar61 = bVar50;
  do {
    pgVar3 = (ppVar23->second).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
             .arrays.groups_;
    pgVar19 = pgVar3 + (long)pbVar29;
    local_168 = pgVar19->m[0].n;
    uStack_167 = pgVar19->m[1].n;
    uStack_166 = pgVar19->m[2].n;
    bStack_165 = pgVar19->m[3].n;
    uStack_164 = pgVar19->m[4].n;
    uStack_163 = pgVar19->m[5].n;
    uStack_162 = pgVar19->m[6].n;
    bStack_161 = pgVar19->m[7].n;
    uStack_160 = pgVar19->m[8].n;
    uStack_15f = pgVar19->m[9].n;
    uStack_15e = pgVar19->m[10].n;
    bStack_15d = pgVar19->m[0xb].n;
    uStack_15c = pgVar19->m[0xc].n;
    uStack_15b = pgVar19->m[0xd].n;
    uStack_15a = pgVar19->m[0xe].n;
    bVar15 = pgVar19->m[0xf].n;
    auVar42[0] = -(local_168 == uVar47);
    auVar42[1] = -(uStack_167 == uVar48);
    auVar42[2] = -(uStack_166 == uVar49);
    auVar42[3] = -(bStack_165 == bVar50);
    auVar42[4] = -(uStack_164 == uVar51);
    auVar42[5] = -(uStack_163 == uVar52);
    auVar42[6] = -(uStack_162 == uVar53);
    auVar42[7] = -(bStack_161 == bVar16);
    auVar42[8] = -(uStack_160 == uVar54);
    auVar42[9] = -(uStack_15f == uVar55);
    auVar42[10] = -(uStack_15e == uVar56);
    auVar42[0xb] = -(bStack_15d == bVar57);
    auVar42[0xc] = -(uStack_15c == uVar58);
    auVar42[0xd] = -(uStack_15b == uVar59);
    auVar42[0xe] = -(uStack_15a == uVar60);
    auVar42[0xf] = -(bVar15 == bVar61);
    uVar17 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe);
    bStack_159 = bVar15;
    if (uVar17 != 0) {
      local_268._0_2_ = CONCAT11(uVar48,uVar47);
      local_268._0_3_ = CONCAT12(uVar49,(undefined2)local_268);
      local_268._0_4_ = CONCAT13(bVar50,(undefined3)local_268);
      local_268._0_5_ = CONCAT14(uVar51,(undefined4)local_268);
      local_268._0_6_ = CONCAT15(uVar52,(undefined5)local_268);
      local_268._0_7_ = CONCAT16(uVar53,(undefined6)local_268);
      local_268 = (pointer)CONCAT17(bVar16,(undefined7)local_268);
      ppVar4 = (ppVar23->second).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
               .arrays.elements_;
      local_2c0 = (group_type_pointer)psVar20;
      local_2b8 = pbVar33;
      local_298 = pbVar25;
      local_278 = pbVar29;
      uStack_260 = uVar54;
      uStack_25f = uVar55;
      uStack_25e = uVar56;
      bStack_25d = bVar57;
      uStack_25c = uVar58;
      uStack_25b = uVar59;
      uStack_25a = uVar60;
      bStack_259 = bVar61;
      local_250 = pbVar30;
      do {
        uVar8 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        ppVar24 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                   *)(ppVar4 + (long)pbVar29 * 0xf + (ulong)uVar8);
        bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_298,&local_288,
                            (basic_string_view<char,_std::char_traits<char>_> *)ppVar24);
        if (bVar14) goto LAB_0017b32b;
        uVar17 = uVar17 - 1 & uVar17;
      } while (uVar17 != 0);
      bVar15 = pgVar3[(long)pbVar29].m[0xf].n;
      pbVar33 = local_2b8;
      psVar20 = local_2c0->m;
      pbVar29 = local_278;
      pbVar30 = local_250;
      pbVar25 = local_298;
      uVar47 = (uchar)local_268;
      uVar48 = local_268._1_1_;
      uVar49 = local_268._2_1_;
      bVar50 = local_268._3_1_;
      uVar51 = local_268._4_1_;
      uVar52 = local_268._5_1_;
      uVar53 = local_268._6_1_;
      bVar16 = local_268._7_1_;
      uVar54 = uStack_260;
      uVar55 = uStack_25f;
      uVar56 = uStack_25e;
      bVar57 = bStack_25d;
      uVar58 = uStack_25c;
      uVar59 = uStack_25b;
      uVar60 = uStack_25a;
      bVar61 = bStack_259;
    }
    if ((*(byte *)&pbVar30[0x2065d]._M_dataplus._M_p & bVar15) == 0) break;
    puVar5 = (undefined1 *)
             (ppVar23->second).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
             .arrays.groups_size_mask;
    psVar9 = ((group_type_pointer)psVar20)->m;
    psVar20 = ((group_type_pointer)psVar20)->m + 1;
    pbVar29 = (pointer)((ulong)((long)&(pbVar29->_M_dataplus)._M_p + (long)(psVar9 + 1)) &
                       (ulong)puVar5);
  } while (psVar20 <= puVar5);
  if ((ppVar23->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .size_ctrl.size <
      (ppVar23->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                *)pbVar25,(size_t)pbVar21,(size_t)pbVar33,&local_2c1,&local_288);
    ppVar24 = local_2a0;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                *)pbVar25,(size_t)pbVar33,&local_2c1,&local_288);
    ppVar24 = local_2a0;
  }
LAB_0017b32b:
  *(undefined4 *)
   &(ppVar24->second).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
    .arrays.groups_size_index = 2;
  (ppVar24->second).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  .arrays.groups_size_mask = 0;
  (ppVar24->second).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  local_248._M_len = 5;
  local_248._M_str = "slang";
  pgVar19 = (group_type_pointer)detail::hashing::hash("slang",5);
  pcVar31 = (pointer)((ulong)pgVar19 >>
                     ((byte)loptions.commentHandlers.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                            .arrays.groups_size_index & 0x3f));
  lVar27 = ((ulong)pgVar19 & 0xff) * 4;
  uVar47 = (&UNK_0040c7ac)[lVar27];
  uVar48 = (&UNK_0040c7ad)[lVar27];
  uVar49 = (&UNK_0040c7ae)[lVar27];
  bVar50 = (&UNK_0040c7af)[lVar27];
  pbVar33 = (pointer)(ulong)((uint)pgVar19 & 7);
  pbVar25 = (pointer)0x0;
  pcVar26 = pcVar31;
  uVar51 = uVar47;
  uVar52 = uVar48;
  uVar53 = uVar49;
  bVar16 = bVar50;
  uVar54 = uVar47;
  uVar55 = uVar48;
  uVar56 = uVar49;
  bVar57 = bVar50;
  uVar58 = uVar47;
  uVar59 = uVar48;
  uVar60 = uVar49;
  bVar61 = bVar50;
  do {
    ppVar11 = loptions.commentHandlers.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
              .arrays.elements_;
    pgVar10 = loptions.commentHandlers.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
              .arrays.groups_;
    pgVar1 = loptions.commentHandlers.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
             .arrays.groups_ + (long)pcVar26;
    local_178 = pgVar1->m[0].n;
    uStack_177 = pgVar1->m[1].n;
    uStack_176 = pgVar1->m[2].n;
    bStack_175 = pgVar1->m[3].n;
    uStack_174 = pgVar1->m[4].n;
    uStack_173 = pgVar1->m[5].n;
    uStack_172 = pgVar1->m[6].n;
    bStack_171 = pgVar1->m[7].n;
    uStack_170 = pgVar1->m[8].n;
    uStack_16f = pgVar1->m[9].n;
    uStack_16e = pgVar1->m[10].n;
    bStack_16d = pgVar1->m[0xb].n;
    uStack_16c = pgVar1->m[0xc].n;
    uStack_16b = pgVar1->m[0xd].n;
    uStack_16a = pgVar1->m[0xe].n;
    bVar15 = pgVar1->m[0xf].n;
    auVar43[0] = -(local_178 == uVar47);
    auVar43[1] = -(uStack_177 == uVar48);
    auVar43[2] = -(uStack_176 == uVar49);
    auVar43[3] = -(bStack_175 == bVar50);
    auVar43[4] = -(uStack_174 == uVar51);
    auVar43[5] = -(uStack_173 == uVar52);
    auVar43[6] = -(uStack_172 == uVar53);
    auVar43[7] = -(bStack_171 == bVar16);
    auVar43[8] = -(uStack_170 == uVar54);
    auVar43[9] = -(uStack_16f == uVar55);
    auVar43[10] = -(uStack_16e == uVar56);
    auVar43[0xb] = -(bStack_16d == bVar57);
    auVar43[0xc] = -(uStack_16c == uVar58);
    auVar43[0xd] = -(uStack_16b == uVar59);
    auVar43[0xe] = -(uStack_16a == uVar60);
    auVar43[0xf] = -(bVar15 == bVar61);
    uVar17 = (uint)(ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe);
    bStack_169 = bVar15;
    if (uVar17 != 0) {
      local_298._0_2_ = CONCAT11(uVar48,uVar47);
      local_298._0_3_ = CONCAT12(uVar49,(undefined2)local_298);
      local_298._0_4_ = CONCAT13(bVar50,(undefined3)local_298);
      local_298._0_5_ = CONCAT14(uVar51,(undefined4)local_298);
      local_298._0_6_ = CONCAT15(uVar52,(undefined5)local_298);
      local_298._0_7_ = CONCAT16(uVar53,(undefined6)local_298);
      local_298 = (pointer)CONCAT17(bVar16,(undefined7)local_298);
      local_2c0 = pgVar19;
      local_2b8 = pbVar25;
      uStack_290 = uVar54;
      uStack_28f = uVar55;
      uStack_28e = uVar56;
      bStack_28d = bVar57;
      uStack_28c = uVar58;
      uStack_28b = uVar59;
      uStack_28a = uVar60;
      bStack_289 = bVar61;
      local_278 = pbVar33;
      local_268 = pcVar26;
      do {
        iVar7 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
          }
        }
        ppVar23 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                   *)((long)&ppVar11[(long)pcVar26 * 0xf].first._M_len + (ulong)(uint)(iVar7 << 6));
        bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            &loptions,&local_248,
                            (basic_string_view<char,_std::char_traits<char>_> *)ppVar23);
        if (bVar14) goto LAB_0017b4be;
        uVar17 = uVar17 - 1 & uVar17;
      } while (uVar17 != 0);
      bVar15 = pgVar10[(long)pcVar26].m[0xf].n;
      pgVar19 = local_2c0;
      pbVar25 = local_2b8;
      pcVar26 = local_268;
      pbVar33 = local_278;
      uVar47 = (uchar)local_298;
      uVar48 = local_298._1_1_;
      uVar49 = local_298._2_1_;
      bVar50 = local_298._3_1_;
      uVar51 = local_298._4_1_;
      uVar52 = local_298._5_1_;
      uVar53 = local_298._6_1_;
      bVar16 = local_298._7_1_;
      uVar54 = uStack_290;
      uVar55 = uStack_28f;
      uVar56 = uStack_28e;
      bVar57 = bStack_28d;
      uVar58 = uStack_28c;
      uVar59 = uStack_28b;
      uVar60 = uStack_28a;
      bVar61 = bStack_289;
    }
    if ((*(byte *)&pbVar33[0x2065d]._M_dataplus._M_p & bVar15) == 0) break;
    pcVar26 = pcVar26 + (long)pbVar25;
    pbVar25 = (pointer)((long)&(pbVar25->_M_dataplus)._M_p + 1);
    pcVar26 = (pointer)((ulong)(pcVar26 + 1) &
                       loptions.commentHandlers.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                       .arrays.groups_size_mask);
  } while (pbVar25 <=
           loptions.commentHandlers.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
           .arrays.groups_size_mask);
  if (loptions.commentHandlers.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
      .size_ctrl.size <
      loptions.commentHandlers.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&loptions,(size_t)pcVar31,(size_t)pgVar19,(try_emplace_args_t *)&local_288,
               &local_248);
    ppVar23 = local_2a0;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&loptions,(size_t)pgVar19,(try_emplace_args_t *)&local_288,&local_248);
    ppVar23 = local_2a0;
  }
LAB_0017b4be:
  pbVar25 = (pointer)&ppVar23->second;
  local_288._M_len = 9;
  local_288._M_str = "lint_save";
  pbVar33 = (pointer)detail::hashing::hash("lint_save",9);
  pbVar21 = (pointer)((ulong)pbVar33 >>
                     ((byte)(ppVar23->second).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                            .arrays.groups_size_index & 0x3f));
  lVar27 = ((ulong)pbVar33 & 0xff) * 4;
  uVar47 = (&UNK_0040c7ac)[lVar27];
  uVar48 = (&UNK_0040c7ad)[lVar27];
  uVar49 = (&UNK_0040c7ae)[lVar27];
  bVar50 = (&UNK_0040c7af)[lVar27];
  pbVar30 = (pointer)(ulong)((uint)pbVar33 & 7);
  psVar20 = (slot_type *)0x0;
  pbVar29 = pbVar21;
  uVar51 = uVar47;
  uVar52 = uVar48;
  uVar53 = uVar49;
  bVar16 = bVar50;
  uVar54 = uVar47;
  uVar55 = uVar48;
  uVar56 = uVar49;
  bVar57 = bVar50;
  uVar58 = uVar47;
  uVar59 = uVar48;
  uVar60 = uVar49;
  bVar61 = bVar50;
  do {
    pgVar3 = (ppVar23->second).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
             .arrays.groups_;
    pgVar19 = pgVar3 + (long)pbVar29;
    local_188 = pgVar19->m[0].n;
    uStack_187 = pgVar19->m[1].n;
    uStack_186 = pgVar19->m[2].n;
    bStack_185 = pgVar19->m[3].n;
    uStack_184 = pgVar19->m[4].n;
    uStack_183 = pgVar19->m[5].n;
    uStack_182 = pgVar19->m[6].n;
    bStack_181 = pgVar19->m[7].n;
    uStack_180 = pgVar19->m[8].n;
    uStack_17f = pgVar19->m[9].n;
    uStack_17e = pgVar19->m[10].n;
    bStack_17d = pgVar19->m[0xb].n;
    uStack_17c = pgVar19->m[0xc].n;
    uStack_17b = pgVar19->m[0xd].n;
    uStack_17a = pgVar19->m[0xe].n;
    bVar15 = pgVar19->m[0xf].n;
    auVar44[0] = -(local_188 == uVar47);
    auVar44[1] = -(uStack_187 == uVar48);
    auVar44[2] = -(uStack_186 == uVar49);
    auVar44[3] = -(bStack_185 == bVar50);
    auVar44[4] = -(uStack_184 == uVar51);
    auVar44[5] = -(uStack_183 == uVar52);
    auVar44[6] = -(uStack_182 == uVar53);
    auVar44[7] = -(bStack_181 == bVar16);
    auVar44[8] = -(uStack_180 == uVar54);
    auVar44[9] = -(uStack_17f == uVar55);
    auVar44[10] = -(uStack_17e == uVar56);
    auVar44[0xb] = -(bStack_17d == bVar57);
    auVar44[0xc] = -(uStack_17c == uVar58);
    auVar44[0xd] = -(uStack_17b == uVar59);
    auVar44[0xe] = -(uStack_17a == uVar60);
    auVar44[0xf] = -(bVar15 == bVar61);
    uVar17 = (uint)(ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe);
    bStack_179 = bVar15;
    if (uVar17 != 0) {
      local_268._0_2_ = CONCAT11(uVar48,uVar47);
      local_268._0_3_ = CONCAT12(uVar49,(undefined2)local_268);
      local_268._0_4_ = CONCAT13(bVar50,(undefined3)local_268);
      local_268._0_5_ = CONCAT14(uVar51,(undefined4)local_268);
      local_268._0_6_ = CONCAT15(uVar52,(undefined5)local_268);
      local_268._0_7_ = CONCAT16(uVar53,(undefined6)local_268);
      local_268 = (pointer)CONCAT17(bVar16,(undefined7)local_268);
      ppVar4 = (ppVar23->second).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
               .arrays.elements_;
      local_2c0 = (group_type_pointer)psVar20;
      local_2b8 = pbVar33;
      local_298 = pbVar25;
      local_278 = pbVar29;
      uStack_260 = uVar54;
      uStack_25f = uVar55;
      uStack_25e = uVar56;
      bStack_25d = bVar57;
      uStack_25c = uVar58;
      uStack_25b = uVar59;
      uStack_25a = uVar60;
      bStack_259 = bVar61;
      local_250 = pbVar30;
      do {
        uVar8 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        ppVar24 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                   *)(ppVar4 + (long)pbVar29 * 0xf + (ulong)uVar8);
        bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_298,&local_288,
                            (basic_string_view<char,_std::char_traits<char>_> *)ppVar24);
        if (bVar14) goto LAB_0017b63e;
        uVar17 = uVar17 - 1 & uVar17;
      } while (uVar17 != 0);
      bVar15 = pgVar3[(long)pbVar29].m[0xf].n;
      pbVar33 = local_2b8;
      psVar20 = local_2c0->m;
      pbVar29 = local_278;
      pbVar30 = local_250;
      pbVar25 = local_298;
      uVar47 = (uchar)local_268;
      uVar48 = local_268._1_1_;
      uVar49 = local_268._2_1_;
      bVar50 = local_268._3_1_;
      uVar51 = local_268._4_1_;
      uVar52 = local_268._5_1_;
      uVar53 = local_268._6_1_;
      bVar16 = local_268._7_1_;
      uVar54 = uStack_260;
      uVar55 = uStack_25f;
      uVar56 = uStack_25e;
      bVar57 = bStack_25d;
      uVar58 = uStack_25c;
      uVar59 = uStack_25b;
      uVar60 = uStack_25a;
      bVar61 = bStack_259;
    }
    if ((*(byte *)&pbVar30[0x2065d]._M_dataplus._M_p & bVar15) == 0) break;
    puVar5 = (undefined1 *)
             (ppVar23->second).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
             .arrays.groups_size_mask;
    psVar9 = ((group_type_pointer)psVar20)->m;
    psVar20 = ((group_type_pointer)psVar20)->m + 1;
    pbVar29 = (pointer)((ulong)((long)&(pbVar29->_M_dataplus)._M_p + (long)(psVar9 + 1)) &
                       (ulong)puVar5);
  } while (psVar20 <= puVar5);
  if ((ppVar23->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .size_ctrl.size <
      (ppVar23->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                *)pbVar25,(size_t)pbVar21,(size_t)pbVar33,&local_2c1,&local_288);
    ppVar24 = local_2a0;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                *)pbVar25,(size_t)pbVar33,&local_2c1,&local_288);
    ppVar24 = local_2a0;
  }
LAB_0017b63e:
  *(undefined4 *)
   &(ppVar24->second).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
    .arrays.groups_size_index = 4;
  (ppVar24->second).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  .arrays.groups_size_mask = 0;
  (ppVar24->second).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  local_248._M_len = 5;
  local_248._M_str = "slang";
  pgVar19 = (group_type_pointer)detail::hashing::hash("slang",5);
  pcVar31 = (pointer)((ulong)pgVar19 >>
                     ((byte)loptions.commentHandlers.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                            .arrays.groups_size_index & 0x3f));
  lVar27 = ((ulong)pgVar19 & 0xff) * 4;
  uVar47 = (&UNK_0040c7ac)[lVar27];
  uVar48 = (&UNK_0040c7ad)[lVar27];
  uVar49 = (&UNK_0040c7ae)[lVar27];
  bVar50 = (&UNK_0040c7af)[lVar27];
  pbVar33 = (pointer)(ulong)((uint)pgVar19 & 7);
  pbVar25 = (pointer)0x0;
  pcVar26 = pcVar31;
  uVar51 = uVar47;
  uVar52 = uVar48;
  uVar53 = uVar49;
  bVar16 = bVar50;
  uVar54 = uVar47;
  uVar55 = uVar48;
  uVar56 = uVar49;
  bVar57 = bVar50;
  uVar58 = uVar47;
  uVar59 = uVar48;
  uVar60 = uVar49;
  bVar61 = bVar50;
  do {
    ppVar11 = loptions.commentHandlers.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
              .arrays.elements_;
    pgVar10 = loptions.commentHandlers.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
              .arrays.groups_;
    pgVar1 = loptions.commentHandlers.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
             .arrays.groups_ + (long)pcVar26;
    local_198 = pgVar1->m[0].n;
    uStack_197 = pgVar1->m[1].n;
    uStack_196 = pgVar1->m[2].n;
    bStack_195 = pgVar1->m[3].n;
    uStack_194 = pgVar1->m[4].n;
    uStack_193 = pgVar1->m[5].n;
    uStack_192 = pgVar1->m[6].n;
    bStack_191 = pgVar1->m[7].n;
    uStack_190 = pgVar1->m[8].n;
    uStack_18f = pgVar1->m[9].n;
    uStack_18e = pgVar1->m[10].n;
    bStack_18d = pgVar1->m[0xb].n;
    uStack_18c = pgVar1->m[0xc].n;
    uStack_18b = pgVar1->m[0xd].n;
    uStack_18a = pgVar1->m[0xe].n;
    bVar15 = pgVar1->m[0xf].n;
    auVar45[0] = -(local_198 == uVar47);
    auVar45[1] = -(uStack_197 == uVar48);
    auVar45[2] = -(uStack_196 == uVar49);
    auVar45[3] = -(bStack_195 == bVar50);
    auVar45[4] = -(uStack_194 == uVar51);
    auVar45[5] = -(uStack_193 == uVar52);
    auVar45[6] = -(uStack_192 == uVar53);
    auVar45[7] = -(bStack_191 == bVar16);
    auVar45[8] = -(uStack_190 == uVar54);
    auVar45[9] = -(uStack_18f == uVar55);
    auVar45[10] = -(uStack_18e == uVar56);
    auVar45[0xb] = -(bStack_18d == bVar57);
    auVar45[0xc] = -(uStack_18c == uVar58);
    auVar45[0xd] = -(uStack_18b == uVar59);
    auVar45[0xe] = -(uStack_18a == uVar60);
    auVar45[0xf] = -(bVar15 == bVar61);
    uVar17 = (uint)(ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe);
    bStack_189 = bVar15;
    if (uVar17 != 0) {
      local_298._0_2_ = CONCAT11(uVar48,uVar47);
      local_298._0_3_ = CONCAT12(uVar49,(undefined2)local_298);
      local_298._0_4_ = CONCAT13(bVar50,(undefined3)local_298);
      local_298._0_5_ = CONCAT14(uVar51,(undefined4)local_298);
      local_298._0_6_ = CONCAT15(uVar52,(undefined5)local_298);
      local_298._0_7_ = CONCAT16(uVar53,(undefined6)local_298);
      local_298 = (pointer)CONCAT17(bVar16,(undefined7)local_298);
      local_2c0 = pgVar19;
      local_2b8 = pbVar25;
      uStack_290 = uVar54;
      uStack_28f = uVar55;
      uStack_28e = uVar56;
      bStack_28d = bVar57;
      uStack_28c = uVar58;
      uStack_28b = uVar59;
      uStack_28a = uVar60;
      bStack_289 = bVar61;
      local_278 = pbVar33;
      local_268 = pcVar26;
      do {
        iVar7 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
          }
        }
        ppVar23 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                   *)((long)&ppVar11[(long)pcVar26 * 0xf].first._M_len + (ulong)(uint)(iVar7 << 6));
        bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            &loptions,&local_248,
                            (basic_string_view<char,_std::char_traits<char>_> *)ppVar23);
        if (bVar14) goto LAB_0017b7d2;
        uVar17 = uVar17 - 1 & uVar17;
      } while (uVar17 != 0);
      bVar15 = pgVar10[(long)pcVar26].m[0xf].n;
      pgVar19 = local_2c0;
      pbVar25 = local_2b8;
      pcVar26 = local_268;
      pbVar33 = local_278;
      uVar47 = (uchar)local_298;
      uVar48 = local_298._1_1_;
      uVar49 = local_298._2_1_;
      bVar50 = local_298._3_1_;
      uVar51 = local_298._4_1_;
      uVar52 = local_298._5_1_;
      uVar53 = local_298._6_1_;
      bVar16 = local_298._7_1_;
      uVar54 = uStack_290;
      uVar55 = uStack_28f;
      uVar56 = uStack_28e;
      bVar57 = bStack_28d;
      uVar58 = uStack_28c;
      uVar59 = uStack_28b;
      uVar60 = uStack_28a;
      bVar61 = bStack_289;
    }
    if ((*(byte *)&pbVar33[0x2065d]._M_dataplus._M_p & bVar15) == 0) break;
    pcVar26 = pcVar26 + (long)pbVar25;
    pbVar25 = (pointer)((long)&(pbVar25->_M_dataplus)._M_p + 1);
    pcVar26 = (pointer)((ulong)(pcVar26 + 1) &
                       loptions.commentHandlers.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                       .arrays.groups_size_mask);
  } while (pbVar25 <=
           loptions.commentHandlers.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
           .arrays.groups_size_mask);
  if (loptions.commentHandlers.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
      .size_ctrl.size <
      loptions.commentHandlers.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&loptions,(size_t)pcVar31,(size_t)pgVar19,(try_emplace_args_t *)&local_288,
               &local_248);
    ppVar23 = local_2a0;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&loptions,(size_t)pgVar19,(try_emplace_args_t *)&local_288,&local_248);
    ppVar23 = local_2a0;
  }
LAB_0017b7d2:
  pbVar25 = (pointer)&ppVar23->second;
  local_288._M_len = 0xc;
  local_288._M_str = "lint_restore";
  pbVar33 = (pointer)detail::hashing::hash("lint_restore",0xc);
  pbVar21 = (pointer)((ulong)pbVar33 >>
                     ((byte)(ppVar23->second).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                            .arrays.groups_size_index & 0x3f));
  lVar27 = ((ulong)pbVar33 & 0xff) * 4;
  uVar47 = (&UNK_0040c7ac)[lVar27];
  uVar48 = (&UNK_0040c7ad)[lVar27];
  uVar49 = (&UNK_0040c7ae)[lVar27];
  bVar50 = (&UNK_0040c7af)[lVar27];
  pbVar30 = (pointer)(ulong)((uint)pbVar33 & 7);
  psVar20 = (slot_type *)0x0;
  pbVar29 = pbVar21;
  uVar51 = uVar47;
  uVar52 = uVar48;
  uVar53 = uVar49;
  bVar16 = bVar50;
  uVar54 = uVar47;
  uVar55 = uVar48;
  uVar56 = uVar49;
  bVar57 = bVar50;
  uVar58 = uVar47;
  uVar59 = uVar48;
  uVar60 = uVar49;
  bVar61 = bVar50;
  do {
    pgVar3 = (ppVar23->second).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
             .arrays.groups_;
    pgVar19 = pgVar3 + (long)pbVar29;
    local_1a8 = pgVar19->m[0].n;
    uStack_1a7 = pgVar19->m[1].n;
    uStack_1a6 = pgVar19->m[2].n;
    bStack_1a5 = pgVar19->m[3].n;
    uStack_1a4 = pgVar19->m[4].n;
    uStack_1a3 = pgVar19->m[5].n;
    uStack_1a2 = pgVar19->m[6].n;
    bStack_1a1 = pgVar19->m[7].n;
    uStack_1a0 = pgVar19->m[8].n;
    uStack_19f = pgVar19->m[9].n;
    uStack_19e = pgVar19->m[10].n;
    bStack_19d = pgVar19->m[0xb].n;
    uStack_19c = pgVar19->m[0xc].n;
    uStack_19b = pgVar19->m[0xd].n;
    uStack_19a = pgVar19->m[0xe].n;
    bVar15 = pgVar19->m[0xf].n;
    auVar46[0] = -(local_1a8 == uVar47);
    auVar46[1] = -(uStack_1a7 == uVar48);
    auVar46[2] = -(uStack_1a6 == uVar49);
    auVar46[3] = -(bStack_1a5 == bVar50);
    auVar46[4] = -(uStack_1a4 == uVar51);
    auVar46[5] = -(uStack_1a3 == uVar52);
    auVar46[6] = -(uStack_1a2 == uVar53);
    auVar46[7] = -(bStack_1a1 == bVar16);
    auVar46[8] = -(uStack_1a0 == uVar54);
    auVar46[9] = -(uStack_19f == uVar55);
    auVar46[10] = -(uStack_19e == uVar56);
    auVar46[0xb] = -(bStack_19d == bVar57);
    auVar46[0xc] = -(uStack_19c == uVar58);
    auVar46[0xd] = -(uStack_19b == uVar59);
    auVar46[0xe] = -(uStack_19a == uVar60);
    auVar46[0xf] = -(bVar15 == bVar61);
    uVar17 = (uint)(ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe);
    bStack_199 = bVar15;
    if (uVar17 != 0) {
      local_268._0_2_ = CONCAT11(uVar48,uVar47);
      local_268._0_3_ = CONCAT12(uVar49,(undefined2)local_268);
      local_268._0_4_ = CONCAT13(bVar50,(undefined3)local_268);
      local_268._0_5_ = CONCAT14(uVar51,(undefined4)local_268);
      local_268._0_6_ = CONCAT15(uVar52,(undefined5)local_268);
      local_268._0_7_ = CONCAT16(uVar53,(undefined6)local_268);
      local_268 = (pointer)CONCAT17(bVar16,(undefined7)local_268);
      ppVar4 = (ppVar23->second).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
               .arrays.elements_;
      local_2c0 = (group_type_pointer)psVar20;
      local_2b8 = pbVar33;
      local_298 = pbVar25;
      local_278 = pbVar29;
      uStack_260 = uVar54;
      uStack_25f = uVar55;
      uStack_25e = uVar56;
      bStack_25d = bVar57;
      uStack_25c = uVar58;
      uStack_25b = uVar59;
      uStack_25a = uVar60;
      bStack_259 = bVar61;
      local_250 = pbVar30;
      do {
        uVar8 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        ppVar24 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                   *)(ppVar4 + (long)pbVar29 * 0xf + (ulong)uVar8);
        bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_298,&local_288,
                            (basic_string_view<char,_std::char_traits<char>_> *)ppVar24);
        if (bVar14) goto LAB_0017b94b;
        uVar17 = uVar17 - 1 & uVar17;
      } while (uVar17 != 0);
      bVar15 = pgVar3[(long)pbVar29].m[0xf].n;
      pbVar33 = local_2b8;
      pbVar25 = local_298;
      psVar20 = local_2c0->m;
      pbVar29 = local_278;
      pbVar30 = local_250;
      uVar47 = (uchar)local_268;
      uVar48 = local_268._1_1_;
      uVar49 = local_268._2_1_;
      bVar50 = local_268._3_1_;
      uVar51 = local_268._4_1_;
      uVar52 = local_268._5_1_;
      uVar53 = local_268._6_1_;
      bVar16 = local_268._7_1_;
      uVar54 = uStack_260;
      uVar55 = uStack_25f;
      uVar56 = uStack_25e;
      bVar57 = bStack_25d;
      uVar58 = uStack_25c;
      uVar59 = uStack_25b;
      uVar60 = uStack_25a;
      bVar61 = bStack_259;
    }
    if ((*(byte *)&pbVar30[0x2065d]._M_dataplus._M_p & bVar15) == 0) break;
    puVar5 = (undefined1 *)
             (ppVar23->second).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
             .arrays.groups_size_mask;
    psVar9 = ((group_type_pointer)psVar20)->m;
    psVar20 = ((group_type_pointer)psVar20)->m + 1;
    pbVar29 = (pointer)((ulong)((long)&(pbVar29->_M_dataplus)._M_p + (long)(psVar9 + 1)) &
                       (ulong)puVar5);
  } while (psVar20 <= puVar5);
  if ((ppVar23->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .size_ctrl.size <
      (ppVar23->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                *)pbVar25,(size_t)pbVar21,(size_t)pbVar33,&local_2c1,&local_288);
    ppVar24 = local_2a0;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2b0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                *)pbVar25,(size_t)pbVar33,&local_2c1,&local_288);
    ppVar24 = local_2a0;
  }
LAB_0017b94b:
  this_01 = local_1b8;
  *(undefined4 *)
   &(ppVar24->second).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
    .arrays.groups_size_index = 5;
  (ppVar24->second).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  .arrays.groups_size_mask = 0;
  (ppVar24->second).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  local_2b0._0_4_ = 0x400;
  if ((this->options).maxParseDepth.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    local_2b0._0_4_ =
         (this->options).maxParseDepth.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload._M_value;
  }
  local_2b0._4_4_ = this->languageVersion;
  Bag::set<slang::driver::SourceOptions&>(local_1b8,&local_1c8);
  Bag::set<slang::parsing::PreprocessorOptions&>(this_01,&ppoptions);
  Bag::set<slang::parsing::LexerOptions&>(this_01,&loptions);
  Bag::set<slang::parsing::ParserOptions&>(this_01,(ParserOptions *)local_2b0);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                 *)&loptions);
  parsing::PreprocessorOptions::~PreprocessorOptions(&ppoptions);
  return;
}

Assistant:

void Driver::addParseOptions(Bag& bag) const {
    SourceOptions soptions;
    soptions.numThreads = options.numThreads;
    soptions.singleUnit = options.singleUnit == true;
    soptions.onlyLint = options.lintMode();
    soptions.librariesInheritMacros = options.librariesInheritMacros == true;

    PreprocessorOptions ppoptions;
    ppoptions.predefines = options.defines;
    ppoptions.undefines = options.undefines;
    ppoptions.predefineSource = "<command-line>";
    ppoptions.languageVersion = languageVersion;
    if (options.maxIncludeDepth.has_value())
        ppoptions.maxIncludeDepth = *options.maxIncludeDepth;
    for (const auto& d : options.ignoreDirectives)
        ppoptions.ignoreDirectives.emplace(d);

    LexerOptions loptions;
    loptions.languageVersion = languageVersion;
    loptions.enableLegacyProtect = options.enableLegacyProtect == true;
    if (options.maxLexerErrors.has_value())
        loptions.maxErrors = *options.maxLexerErrors;

    if (loptions.enableLegacyProtect)
        loptions.commentHandlers["pragma"]["protect"] = {CommentHandler::Protect};

    for (auto& [common, start, end] : translateOffFormats)
        loptions.commentHandlers[common][start] = {CommentHandler::TranslateOff, end};

    loptions.commentHandlers["slang"]["lint_off"] = {CommentHandler::LintOff};
    loptions.commentHandlers["slang"]["lint_on"] = {CommentHandler::LintOn};
    loptions.commentHandlers["slang"]["lint_save"] = {CommentHandler::LintSave};
    loptions.commentHandlers["slang"]["lint_restore"] = {CommentHandler::LintRestore};

    ParserOptions poptions;
    poptions.languageVersion = languageVersion;
    if (options.maxParseDepth.has_value())
        poptions.maxRecursionDepth = *options.maxParseDepth;

    bag.set(soptions);
    bag.set(ppoptions);
    bag.set(loptions);
    bag.set(poptions);
}